

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

vector<wasm::Type,_std::allocator<wasm::Type>_> * __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Scanner::getRelevantTypes(wasm::Type_
          (vector<wasm::Type,_std::allocator<wasm::Type>_> *__return_storage_ptr__,void *this,
          Type type)

{
  iterator __position;
  bool bVar1;
  Type TVar2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *extraout_RAX;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *extraout_RAX_00;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *extraout_RAX_01;
  HeapType heapType;
  byte extraout_DL;
  byte extraout_DL_00;
  Type type_00;
  Type type_01;
  initializer_list<wasm::Type> __l;
  Type local_50;
  undefined1 local_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> nullable;
  Type type_local;
  
  nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  if (this < (void *)0x7 || ((ulong)this & 1) != 0) {
    __l._M_len = 1;
    __l._M_array = (iterator)local_48;
    local_48 = (undefined1  [8])this;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              (__return_storage_ptr__,__l,(allocator_type *)&local_50);
    heapType.id = (uintptr_t)extraout_RAX_01;
  }
  else {
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,(iterator)0x0
               ,(Type *)&nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((ulong)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 3) == 0 &&
        (pointer)0x6 <
        nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      TVar2 = Type::with((Type *)&nullable.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,Nullable);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,(void *)TVar2.id,type_00);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_48,
                 CONCAT71(nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (byte)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                ._M_impl.super__Vector_impl_data._M_start));
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48,
                        (long)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_48);
      }
    }
    bVar1 = Type::isExact((Type *)&nullable.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      TVar2 = Type::with((Type *)&nullable.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,Inexact);
      Type_((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,(void *)TVar2.id,type_01);
      std::vector<wasm::Type,std::allocator<wasm::Type>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish,local_48,
                 CONCAT71(nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                          (byte)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                ._M_impl.super__Vector_impl_data._M_start));
      heapType.id = (uintptr_t)extraout_RAX;
      if (local_48 != (undefined1  [8])0x0) {
        operator_delete((void *)local_48,
                        (long)nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_48);
        heapType.id = (uintptr_t)extraout_RAX_00;
      }
    }
    else {
      local_50.id = (uintptr_t)
                    Type::getHeapType((Type *)&nullable.
                                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      heapType.id = wasm::HeapType::getSuperType();
      if ((extraout_DL & 1) != 0) {
        nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = extraout_DL;
        do {
          local_48 = (undefined1  [8])heapType.id;
          local_50 = Type::with((Type *)&nullable.
                                         super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,heapType
                               );
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                      (__return_storage_ptr__,__position,&local_50);
          }
          else {
            (__position._M_current)->id = local_50.id;
            (__return_storage_ptr__->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          heapType.id = wasm::HeapType::getSuperType();
          nullable.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = extraout_DL_00;
        } while ((extraout_DL_00 & 1) != 0);
      }
    }
  }
  return (vector<wasm::Type,_std::allocator<wasm::Type>_> *)heapType.id;
}

Assistant:

std::vector<Type> getRelevantTypes(Type type) {
      // Given an expression of a type, we can replace not only other
      // expressions with the same type, but also supertypes - since then we'd
      // be replacing with a subtype, which is valid.
      if (!type.isRef()) {
        return {type};
      }

      std::vector<Type> ret;
      ret.push_back(type);

      if (type.isNonNullable()) {
        auto nullable = getRelevantTypes(type.with(Nullable));
        ret.insert(ret.end(), nullable.begin(), nullable.end());
      }
      if (type.isExact()) {
        auto inexact = getRelevantTypes(type.with(Inexact));
        ret.insert(ret.end(), inexact.begin(), inexact.end());
        // Do not consider exact references to supertypes.
        return ret;
      }

      for (auto heapType = type.getHeapType().getSuperType(); heapType;
           heapType = heapType->getSuperType()) {
        ret.push_back(type.with(*heapType));
      }

      return ret;
    }